

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O1

void __thiscall cppforth::Forth::memFree(Forth *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  pointer pVVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  pointer pVVar6;
  pointer pVVar7;
  ulong uVar8;
  ulong uVar9;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  
  requireDStackDepth(this,1,"FREE");
  uVar5 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pVVar2 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar7 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pVVar7 - (long)pVVar2 >> 5;
  uVar9 = uVar8;
  do {
    pVVar6 = pVVar7;
    uVar9 = uVar9 - 1;
    if (uVar9 < 3) {
      uVar5 = 0xffffffc4;
      goto LAB_00115abb;
    }
    pVVar7 = pVVar6 + -1;
  } while (pVVar6[-1].start != uVar5);
  if (this->VirtualMemoryFreeSegment == pVVar6[-1].end) {
    this->VirtualMemoryFreeSegment = pVVar6[-1].start;
  }
  uVar8 = uVar8 - 1;
  if (uVar9 < uVar8) {
    uVar3 = *(undefined8 *)pVVar7;
    local_40 = pVVar6[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_38 = pVVar6[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_30 = pVVar6[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pVVar6[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pVVar6[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar6[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar1 = &pVVar2[uVar8].segment;
    uVar4 = *(undefined8 *)((long)(pvVar1 + -1) + 0x10);
    pVVar7->start = (int)uVar4;
    pVVar7->end = (int)((ulong)uVar4 >> 0x20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pVVar6[-1].segment,pvVar1);
    *(undefined8 *)((long)(pvVar1 + -1) + 0x10) = uVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar1,&local_40);
    if (local_40 != (pointer)0x0) {
      operator_delete(local_40,(long)local_30 - (long)local_40);
    }
  }
  std::
  vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
  ::resize(&this->VirtualMemory,
           ((long)(this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
  uVar5 = 0;
LAB_00115abb:
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar5);
  return;
}

Assistant:

void memFree() {
			REQUIRE_DSTACK_DEPTH(1, "FREE");
			auto addr = dStack.getTop();
			for (auto i = VirtualMemory.size() - 1; i > vmSegmentDataSpace; --i){
				if (VirtualMemory[i].start == addr){
					if (VirtualMemoryFreeSegment == VirtualMemory[i].end){
						VirtualMemoryFreeSegment = VirtualMemory[i].start;
					}
					if (i < VirtualMemory.size() - 1){
						std::swap(VirtualMemory[i], VirtualMemory[VirtualMemory.size() - 1]);
					}
					VirtualMemory.resize(VirtualMemory.size() - 1);

					dStack.setTop(0);
					return;
				}
			}
			dStack.setTop(CELL(errorFree));
		}